

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

void __thiscall duckdb::DuckTableEntry::CommitAlter(DuckTableEntry *this,string *column_name)

{
  pointer pCVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  ColumnList *pCVar4;
  ColumnDefinition *this_00;
  string *psVar5;
  column_t *pcVar6;
  LogicalIndex logical;
  PhysicalIndex column_index;
  DataTable *this_01;
  idx_t iVar7;
  ColumnListIterator CVar8;
  ColumnLogicalIteratorInternal local_60;
  optional_idx local_40;
  ColumnList *local_38;
  
  local_40.index = 0xffffffffffffffff;
  local_38 = &(this->super_TableCatalogEntry).columns;
  CVar8 = ColumnList::Logical(local_38);
  pCVar4 = CVar8.list;
  local_60.physical = CVar8.physical;
  if (((undefined1  [16])CVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar1 = (pCVar4->columns).
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_60.end = ((long)pCVar1 -
                    (long)(pCVar4->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    iVar7 = ((long)pCVar1 -
             (long)(pCVar4->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    iVar7 = (long)(pCVar4->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pCVar4->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_60.end = iVar7;
  }
  local_60.pos = 0;
  local_60.list = pCVar4;
  do {
    if (((local_60.pos == iVar7) && (local_60.end == iVar7)) && (local_60.list == pCVar4))
    goto LAB_011e0ae7;
    this_00 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_60);
    psVar5 = ColumnDefinition::Name_abi_cxx11_(this_00);
    __n = psVar5->_M_string_length;
    if (__n == column_name->_M_string_length) {
      if (__n == 0) {
LAB_011e0ac6:
        bVar2 = ColumnDefinition::Generated(this_00);
        if (!bVar2) {
          pcVar6 = ColumnDefinition::Oid(this_00);
          optional_idx::optional_idx(&local_40,*pcVar6);
LAB_011e0ae7:
          logical.index = optional_idx::GetIndex(&local_40);
          column_index = ColumnList::LogicalToPhysical(local_38,logical);
          this_01 = shared_ptr<duckdb::DataTable,_true>::operator->(&this->storage);
          DataTable::CommitDropColumn(this_01,column_index.index);
        }
        return;
      }
      iVar3 = bcmp((psVar5->_M_dataplus)._M_p,(column_name->_M_dataplus)._M_p,__n);
      if (iVar3 == 0) goto LAB_011e0ac6;
    }
    local_60.pos = local_60.pos + 1;
  } while( true );
}

Assistant:

void DuckTableEntry::CommitAlter(string &column_name) {
	D_ASSERT(!column_name.empty());
	optional_idx removed_index;
	for (auto &col : columns.Logical()) {
		if (col.Name() == column_name) {
			// No need to alter storage, removed column is generated column
			if (col.Generated()) {
				return;
			}
			removed_index = col.Oid();
			break;
		}
	}

	auto logical_column_index = LogicalIndex(removed_index.GetIndex());
	auto column_index = columns.LogicalToPhysical(logical_column_index).index;
	storage->CommitDropColumn(column_index);
}